

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O2

WebAssemblyArrayBuffer * __thiscall
Js::WebAssemblyArrayBuffer::GrowMemory(WebAssemblyArrayBuffer *this,uint32 newBufferLength)

{
  Type *pTVar1;
  JavascriptLibrary *this_00;
  InterruptPoller *pIVar2;
  code *pcVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  byte *pbVar7;
  WebAssemblyArrayBuffer *pWVar8;
  Recycler *pRVar9;
  void *__ptr;
  undefined4 *puVar10;
  ulong __size;
  uint uVar11;
  ulong size;
  AutoExternalAllocation local_70;
  undefined1 local_58 [8];
  anon_class_16_2_ed7e224f finalizeGrowMemory;
  AutoDisableInterrupt autoDisableInterrupt;
  uint32 newBufferLength_local;
  
  pTVar1 = &(this->super_JavascriptArrayBuffer).super_ArrayBuffer.bufferLength;
  uVar11 = newBufferLength - *pTVar1;
  autoDisableInterrupt._12_4_ = newBufferLength;
  if (newBufferLength < *pTVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                ,0x435,"((0))","UNREACHED");
    if (bVar5) {
      *puVar10 = 0;
      JavascriptError::ThrowTypeError
                ((((((this->super_JavascriptArrayBuffer).super_ArrayBuffer.super_ArrayBufferBase.
                     super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5e492,(PCWSTR)0x0);
    }
LAB_00a01a4d:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  local_58 = (undefined1  [8])&autoDisableInterrupt.field_0xc;
  finalizeGrowMemory.newBufferLength = (uint32 *)this;
  if (uVar11 == 0) {
    this_00 = (((this->super_JavascriptArrayBuffer).super_ArrayBuffer.super_ArrayBufferBase.
                super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr;
    pbVar7 = (byte *)(**(code **)((long)(this->super_JavascriptArrayBuffer).super_ArrayBuffer.
                                        super_ArrayBufferBase.super_DynamicObject.
                                        super_RecyclableObject.super_FinalizableObject.
                                        super_IRecyclerVisitedObject + 0x390))(this);
    pWVar8 = JavascriptLibrary::CreateWebAssemblyArrayBuffer
                       (this_00,pbVar7,
                        (this->super_JavascriptArrayBuffer).super_ArrayBuffer.bufferLength);
LAB_00a01960:
    GrowMemory::anon_class_16_2_ed7e224f::operator()((anon_class_16_2_ed7e224f *)local_58,pWVar8);
    return pWVar8;
  }
  iVar6 = (**(code **)((long)(this->super_JavascriptArrayBuffer).super_ArrayBuffer.
                             super_ArrayBufferBase.super_DynamicObject.super_RecyclableObject.
                             super_FinalizableObject.super_IRecyclerVisitedObject + 0x388))(this);
  if (iVar6 == 0) {
    if (autoDisableInterrupt._12_4_ != uVar11) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                  ,0x466,"(newBufferLength == growSize)",
                                  "newBufferLength == growSize");
      if (!bVar5) goto LAB_00a01a4d;
      *puVar10 = 0;
      uVar11 = autoDisableInterrupt._12_4_;
    }
    pWVar8 = JavascriptLibrary::CreateWebAssemblyArrayBuffer
                       ((((this->super_JavascriptArrayBuffer).super_ArrayBuffer.
                          super_ArrayBufferBase.super_DynamicObject.super_RecyclableObject.type.ptr)
                        ->javascriptLibrary).ptr,uVar11);
    goto LAB_00a01960;
  }
  finalizeGrowMemory.this =
       (WebAssemblyArrayBuffer *)
       ((((((this->super_JavascriptArrayBuffer).super_ArrayBuffer.super_ArrayBufferBase.
            super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
        super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  autoDisableInterrupt.m_threadContext._0_2_ = 0;
  autoDisableInterrupt.m_threadContext._2_1_ = 0;
  pIVar2 = ((ThreadContext *)finalizeGrowMemory.this)->interruptPoller;
  if (pIVar2 != (InterruptPoller *)0x0) {
    autoDisableInterrupt.m_threadContext._0_2_ = (ushort)pIVar2->isDisabled << 8;
    pIVar2->isDisabled = true;
  }
  pRVar9 = RecyclableObject::GetRecycler((RecyclableObject *)this);
  size = (ulong)uVar11;
  bVar5 = Memory::Recycler::RequestExternalMemoryAllocation(pRVar9,size);
  if (bVar5) {
LAB_00a0189e:
    local_70.allocationSucceeded = false;
    local_70.recycler = pRVar9;
    local_70.size = size;
    __ptr = (void *)(**(code **)((long)(this->super_JavascriptArrayBuffer).super_ArrayBuffer.
                                       super_ArrayBufferBase.super_DynamicObject.
                                       super_RecyclableObject.super_FinalizableObject.
                                       super_IRecyclerVisitedObject + 0x390))(this);
    uVar4 = autoDisableInterrupt._12_4_;
    uVar11 = (this->super_JavascriptArrayBuffer).super_ArrayBuffer.bufferLength;
    __size = (ulong)(uint)autoDisableInterrupt._12_4_;
    pbVar7 = (byte *)realloc(__ptr,__size);
    if ((uVar11 < (uint)uVar4) && (pbVar7 != (byte *)0x0)) {
      memset(pbVar7 + uVar11,0,__size - uVar11);
LAB_00a01976:
      autoDisableInterrupt.m_threadContext._2_1_ = 1;
      local_70.allocationSucceeded = true;
    }
    else if (pbVar7 != (byte *)0x0) goto LAB_00a01976;
    anon_func::AutoExternalAllocation::~AutoExternalAllocation(&local_70);
    if (pbVar7 != (byte *)0x0) {
      pRVar9 = RecyclableObject::GetRecycler((RecyclableObject *)this);
      Memory::Recycler::ReportExternalMemoryFree(pRVar9,size);
      pWVar8 = JavascriptLibrary::CreateWebAssemblyArrayBuffer
                         ((((this->super_JavascriptArrayBuffer).super_ArrayBuffer.
                            super_ArrayBufferBase.super_DynamicObject.super_RecyclableObject.type.
                           ptr)->javascriptLibrary).ptr,pbVar7,autoDisableInterrupt._12_4_);
      GrowMemory::anon_class_16_2_ed7e224f::operator()((anon_class_16_2_ed7e224f *)local_58,pWVar8);
      autoDisableInterrupt.m_threadContext._0_1_ = 1;
      goto LAB_00a019c9;
    }
  }
  else {
    Memory::Recycler::CollectNow<(Memory::CollectionFlags)404852739>(pRVar9);
    bVar5 = Memory::Recycler::RequestExternalMemoryAllocation(pRVar9,size);
    if (bVar5) goto LAB_00a0189e;
  }
  pWVar8 = (WebAssemblyArrayBuffer *)0x0;
LAB_00a019c9:
  AutoDisableInterrupt::~AutoDisableInterrupt((AutoDisableInterrupt *)&finalizeGrowMemory.this);
  return pWVar8;
}

Assistant:

WebAssemblyArrayBuffer* WebAssemblyArrayBuffer::GrowMemory(uint32 newBufferLength)
    {
        if (newBufferLength < this->bufferLength)
        {
            Assert(UNREACHED);
            JavascriptError::ThrowTypeError(GetScriptContext(), WASMERR_BufferGrowOnly);
        }

        uint32 growSize = newBufferLength - this->bufferLength;
        const auto finalizeGrowMemory = [&](WebAssemblyArrayBuffer* newArrayBuffer)
        {
            AssertOrFailFast(newArrayBuffer && newArrayBuffer->GetByteLength() == newBufferLength);
            RefCountedBuffer *local = this->GetBufferContent();
            // Detach the buffer from this ArrayBuffer
            this->Detach();
            if (local != nullptr)
            {
                HeapDelete(local);
            }
            return newArrayBuffer;
        };

        // We're not growing the buffer, just create a new WebAssemblyArrayBuffer and detach this
        if (growSize == 0)
        {
            return finalizeGrowMemory(this->GetLibrary()->CreateWebAssemblyArrayBuffer(this->GetBuffer(), this->bufferLength));
        }

#if ENABLE_FAST_ARRAYBUFFER
        // 8Gb Array case
        if (CONFIG_FLAG(WasmFastArray))
        {
            AssertOrFailFast(this->GetBuffer());
            const auto virtualAllocFunc = [&]
            {
                return !!VirtualAlloc(this->GetBuffer() + this->bufferLength, growSize, MEM_COMMIT, PAGE_READWRITE);
            };
            if (!this->GetRecycler()->DoExternalAllocation(growSize, virtualAllocFunc))
            {
                return nullptr;
            }

            // We are transferring the buffer to the new owner.
            // To avoid double-charge to the allocation quota we will free the "diff" amount here.
            this->GetRecycler()->ReportExternalMemoryFree(growSize);

            return finalizeGrowMemory(this->GetLibrary()->CreateWebAssemblyArrayBuffer(this->GetBuffer(), newBufferLength));
        }
#endif

        // No previous buffer case
        if (this->GetByteLength() == 0)
        {
            Assert(newBufferLength == growSize);
            // Creating a new buffer will do the external memory allocation report
            return finalizeGrowMemory(this->GetLibrary()->CreateWebAssemblyArrayBuffer(newBufferLength));
        }

        // Regular growing case
        {
            // Disable Interrupts while doing a ReAlloc to minimize chances to end up in a bad state
            AutoDisableInterrupt autoDisableInterrupt(this->GetScriptContext()->GetThreadContext(), false);

            byte* newBuffer = nullptr;
            const auto reallocFunc = [&]
            {
                newBuffer = ReallocZero(this->GetBuffer(), this->bufferLength, newBufferLength);
                if (newBuffer != nullptr)
                {
                    // Realloc freed this->buffer
                    // if anything goes wrong before we detach, we can't recover the state and should failfast
                    autoDisableInterrupt.RequireExplicitCompletion();
                }
                return !!newBuffer;
            };

            if (!this->GetRecycler()->DoExternalAllocation(growSize, reallocFunc))
            {
                return nullptr;
            }

            // We are transferring the buffer to the new owner.
            // To avoid double-charge to the allocation quota we will free the "diff" amount here.
            this->GetRecycler()->ReportExternalMemoryFree(growSize);

            WebAssemblyArrayBuffer* newArrayBuffer = finalizeGrowMemory(this->GetLibrary()->CreateWebAssemblyArrayBuffer(newBuffer, newBufferLength));
            // We've successfully Detached this buffer and created a new WebAssemblyArrayBuffer
            autoDisableInterrupt.Completed();
            return newArrayBuffer;
        }
    }